

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

void __thiscall
QApplicationPrivate::activateImplicitTouchGrab
          (QApplicationPrivate *this,QWidget *widget,QTouchEvent *touchEvent,
          ImplicitTouchGrabMode grabMode)

{
  QEventPointPrivate *pQVar1;
  long lVar2;
  byte bVar3;
  QEventPoint *p;
  ulong uVar4;
  
  if ((*(short *)(touchEvent + 8) == 0xc2) && (*(long *)(touchEvent + 0x38) != 0)) {
    uVar4 = 0;
    do {
      p = (QEventPoint *)QPointerEvent::point((longlong)touchEvent);
      pQVar1 = (p->d).d.ptr;
      lVar2 = *(long *)(pQVar1 + 0x20);
      if ((((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) || (*(long *)(pQVar1 + 0x28) == 0)) &&
         (bVar3 = QEventPoint::isAccepted(), (grabMode != GrabAllPoints & (bVar3 ^ 1)) == 0)) {
        QMutableEventPoint::setTarget(p,&widget->super_QObject);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < *(ulong *)(touchEvent + 0x38));
  }
  return;
}

Assistant:

void QApplicationPrivate::activateImplicitTouchGrab(QWidget *widget, QTouchEvent *touchEvent,
                                                    ImplicitTouchGrabMode grabMode)
{
    if (touchEvent->type() != QEvent::TouchBegin)
        return;

    // If the widget dispatched the event further (see QGraphicsProxyWidget), then
    // there might already be an implicit grabber. Don't override that. A widget that
    // has partially recognized a gesture needs to grab all points.
    for (int i = 0; i < touchEvent->pointCount(); ++i) {
        auto &ep = touchEvent->point(i);
        if (!QMutableEventPoint::target(ep) && (ep.isAccepted() || grabMode == GrabAllPoints))
            QMutableEventPoint::setTarget(ep, widget);
    }
    // TODO setExclusiveGrabber() to be consistent with Qt Quick?
}